

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O2

uint64 HashLen0to16(char *s,size_t len)

{
  ulong uVar1;
  byte bVar2;
  uint64 uVar3;
  ulong uVar4;
  
  if (8 < len) {
    uVar1 = *(ulong *)(s + (len - 8));
    uVar4 = uVar1 + len;
    bVar2 = (byte)len & 0x3f;
    uVar3 = HashLen16(*(uint64 *)s,uVar4 >> bVar2 | uVar4 << 0x40 - bVar2);
    return uVar3 ^ uVar1;
  }
  if (3 < len) {
    uVar3 = HashLen16(len + (ulong)*(uint *)s * 8,(ulong)*(uint *)(s + (len - 4)));
    return uVar3;
  }
  uVar3 = 0x9ae16a3b2f90404f;
  if (len != 0) {
    uVar4 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x36b62838af619aa9 ^
            (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
    uVar3 = (uVar4 >> 0x2f ^ uVar4) * -0x651e95c4d06fbfb1;
  }
  return uVar3;
}

Assistant:

static uint64 HashLen0to16(const char *s, size_t len) {
  if (len > 8) {
    uint64 a = Fetch64(s);
    uint64 b = Fetch64(s + len - 8);
    return HashLen16(a, RotateByAtLeast1(b + len, len)) ^ b;
  }
  if (len >= 4) {
    uint64 a = Fetch32(s);
    return HashLen16(len + (a << 3), Fetch32(s + len - 4));
  }
  if (len > 0) {
    uint8 a = s[0];
    uint8 b = s[len >> 1];
    uint8 c = s[len - 1];
    uint32 y = static_cast<uint32>(a) + (static_cast<uint32>(b) << 8);
    uint32 z = len + (static_cast<uint32>(c) << 2);
    return ShiftMix(y * k2 ^ z * k3) * k2;
  }
  return k2;
}